

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O2

void __thiscall crypto::hasher::hasher(hasher *this,checksum_type type)

{
  EVP_PKEY_CTX *ctx;
  
  this->active_type = type;
  ctx = (EVP_PKEY_CTX *)(ulong)(type - Adler32);
  switch(ctx) {
  case (EVP_PKEY_CTX *)0x0:
    (this->field_1).adler32.state = 1;
    break;
  case (EVP_PKEY_CTX *)0x1:
    (this->field_1).adler32.state = 0xffffffff;
    return;
  case (EVP_PKEY_CTX *)0x2:
    iterated_hash<crypto::md5_transform>::init
              ((iterated_hash<crypto::md5_transform> *)&(this->field_1).adler32,ctx);
    return;
  case (EVP_PKEY_CTX *)0x3:
    iterated_hash<crypto::sha1_transform>::init
              ((iterated_hash<crypto::sha1_transform> *)&(this->field_1).adler32,ctx);
    return;
  case (EVP_PKEY_CTX *)0x4:
    iterated_hash<crypto::sha256_transform>::init
              ((iterated_hash<crypto::sha256_transform> *)&(this->field_1).adler32,ctx);
    return;
  }
  return;
}

Assistant:

hasher::hasher(checksum_type type) : active_type(type) {
	
	switch(active_type) {
		case crypto::None: break;
		case crypto::Adler32: adler32.init(); break;
		case crypto::CRC32: crc32.init(); break;
		case crypto::MD5: md5.init(); break;
		case crypto::SHA1: sha1.init(); break;
		case crypto::SHA256: sha256.init(); break;
		case crypto::PBKDF2_SHA256_XChaCha20: break;
	};
	
}